

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

ecs_entity_t
components_contains(ecs_world_t *world,ecs_type_t table_type,ecs_type_t type,
                   ecs_entity_t *entity_out,_Bool match_all)

{
  int32_t iVar1;
  void *pvVar2;
  ulong uVar3;
  long *plVar4;
  ecs_entity_t eVar5;
  ecs_entity_t component;
  ecs_record_t *record;
  ecs_entity_t entity;
  ecs_entity_t *c_ptr;
  ecs_entity_t *c_ptr_array;
  int local_38;
  int c_ptr_count;
  int c_ptr_i;
  _Bool match_all_local;
  ecs_entity_t *entity_out_local;
  ecs_type_t type_local;
  ecs_type_t table_type_local;
  ecs_world_t *world_local;
  
  iVar1 = ecs_vector_count(table_type);
  pvVar2 = _ecs_vector_first(table_type,8,0x10);
  local_38 = 0;
  do {
    if (iVar1 <= local_38) {
      return 0;
    }
    uVar3 = *(ulong *)((long)pvVar2 + (long)local_38 * 8);
    if ((uVar3 & 0xff00000000000000) == 0xfd00000000000000) {
      uVar3 = uVar3 & 0xffffffffffffff;
      plVar4 = (long *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,uVar3);
      _ecs_assert(plVar4 != (long *)0x0,0xc,(char *)0x0,"record != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x1d);
      if (plVar4 == (long *)0x0) {
        __assert_fail("record != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x1d,
                      "ecs_entity_t components_contains(ecs_world_t *, ecs_type_t, ecs_type_t, ecs_entity_t *, _Bool)"
                     );
      }
      if ((*plVar4 != 0) &&
         (eVar5 = ecs_type_contains(world,*(ecs_type_t *)*plVar4,type,match_all,true), eVar5 != 0))
      {
        if (entity_out == (ecs_entity_t *)0x0) {
          return eVar5;
        }
        *entity_out = uVar3;
        return eVar5;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static
ecs_entity_t components_contains(
    ecs_world_t *world,
    ecs_type_t table_type,
    ecs_type_t type,
    ecs_entity_t *entity_out,
    bool match_all)
{
    ecs_vector_each(table_type, ecs_entity_t, c_ptr, {
        ecs_entity_t entity = *c_ptr;

        if (ECS_HAS_ROLE(entity, CHILDOF)) {
            entity &= ECS_COMPONENT_MASK;

            ecs_record_t *record = ecs_eis_get(world, entity);
            ecs_assert(record != 0, ECS_INTERNAL_ERROR, NULL);

            if (record->table) {
                ecs_entity_t component = ecs_type_contains(
                    world, record->table->type, type, match_all, true);

                if (component) {
                    if (entity_out) *entity_out = entity;
                    return component;
                }
            }
        }
    });

    return 0;
}